

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void mouse_handling::onMouseWheel(GLFWwindow *window,double dx,double dy)

{
  ImGuiIO *pIVar1;
  double dVar2;
  float speed;
  double dy_local;
  double dx_local;
  GLFWwindow *window_local;
  
  pIVar1 = ImGui::GetIO();
  if ((pIVar1->WantCaptureMouse & 1U) == 0) {
    dVar2 = pow(1.0399999618530273,(double)(float)dy);
    orbitCam.distance = (float)((double)orbitCam.distance * dVar2);
    orbitCam.distance = glm::max<float>(orbitCam.distance,0.01);
  }
  else {
    ImGui_ImplGlfw_ScrollCallback(window,dx,dy);
  }
  return;
}

Assistant:

void onMouseWheel(GLFWwindow* window, double dx, double dy)
    {
        if(ImGui::GetIO().WantCaptureMouse) {
            ImGui_ImplGlfw_ScrollCallback(window, dx, dy);
        }
        else {
            const float speed = 1.04f;
            orbitCam.distance *= pow(speed, (float)dy);
            orbitCam.distance = glm::max(orbitCam.distance, 0.01f);
        }
    }